

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

void sysbvm_primitiveTable_registerFunction
               (sysbvm_functionEntryPoint_t primitiveEntryPoint,char *primitiveName)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (ulong)sysbvm_primitiveTableSize;
  if (uVar1 == 0) {
    uVar1 = 0;
    sysbvm_primitiveTableSize = 0;
  }
  else {
    lVar2 = 0;
    do {
      if (*(sysbvm_functionEntryPoint_t *)((long)&sysbvm_primitiveTable[0].entryPoint + lVar2) ==
          primitiveEntryPoint) {
        return;
      }
      lVar2 = lVar2 + 0x10;
    } while (uVar1 << 4 != lVar2);
    if (0x3ff < sysbvm_primitiveTableSize) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:42: assertion failure: sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY"
                );
      uVar1 = (ulong)sysbvm_primitiveTableSize;
    }
  }
  sysbvm_primitiveTable[uVar1].entryPoint = primitiveEntryPoint;
  sysbvm_primitiveTable[uVar1].name = primitiveName;
  sysbvm_primitiveTableSize = sysbvm_primitiveTableSize + 1;
  return;
}

Assistant:

void sysbvm_primitiveTable_registerFunction(sysbvm_functionEntryPoint_t primitiveEntryPoint, const char *primitiveName)
{
    for(size_t i = 0; i < sysbvm_primitiveTableSize; ++i)
    {
        if(sysbvm_primitiveTable[i].entryPoint == primitiveEntryPoint)
            return;
    }

    SYSBVM_ASSERT(sysbvm_primitiveTableSize < PRIMITIVE_TABLE_CAPACITY);
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].entryPoint = primitiveEntryPoint;
    sysbvm_primitiveTable[sysbvm_primitiveTableSize].name = primitiveName;
    ++sysbvm_primitiveTableSize;
}